

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::CSVMultiFileInfo::CreateReader
          (CSVMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *gstate_p,
          OpenFileInfo *file,idx_t file_idx,MultiFileBindData *bind_data)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  pointer pTVar4;
  MultiFileList *pMVar5;
  CSVBufferManager *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseFileReader,_true> sVar6;
  undefined1 local_479;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  undefined1 local_458 [32];
  CSVReaderOptions options;
  
  pTVar4 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  CSVReaderOptions::CSVReaderOptions(&options,(CSVReaderOptions *)(pTVar4 + 1));
  pMVar5 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&bind_data->file_list);
  iVar3 = (*pMVar5->_vptr_MultiFileList[5])(pMVar5);
  if ((char)iVar3 == '\x01') {
    options.auto_detect = false;
  }
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  buffer_manager.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (file_idx == 0) {
    shared_ptr<duckdb::CSVBufferManager,_true>::operator=
              (&buffer_manager,(shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar4 + 0x23));
    if (buffer_manager.internal.
        super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&buffer_manager);
      CSVBufferManager::GetFilePath_abi_cxx11_((string *)local_458,this_00);
      bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_458,&file->path);
      ::std::__cxx11::string::~string((string *)local_458);
      if (bVar2) {
        ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)
                   &buffer_manager);
      }
    }
  }
  local_479 = *(undefined1 *)((long)&gstate_p[7]._vptr_GlobalTableFunctionState + 1);
  make_shared_ptr<duckdb::CSVFileScan,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::CSVReaderOptions,duckdb::MultiFileOptions_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::CSVSchema&,bool,duckdb::shared_ptr<duckdb::CSVBufferManager,true>,bool>
            ((ClientContext *)local_458,(OpenFileInfo *)context,(CSVReaderOptions *)file,
             (MultiFileOptions *)&options,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&bind_data->file_options,(vector<duckdb::LogicalType,_true> *)&bind_data->names,
             (CSVSchema *)&bind_data->types,(bool *)&pTVar4[0x24].column_ids,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)&local_479,(bool *)&buffer_manager);
  uVar1 = local_458._8_8_;
  local_458._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_458._0_8_;
  *(undefined8 *)(this + 8) = uVar1;
  local_458._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buffer_manager.internal.
              super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CSVReaderOptions::~CSVReaderOptions(&options);
  sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar6.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> CSVMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &gstate_p,
                                                          const OpenFileInfo &file, idx_t file_idx,
                                                          const MultiFileBindData &bind_data) {
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();

	auto options = csv_data.options;
	if (bind_data.file_list->GetExpandResult() == FileExpandResult::SINGLE_FILE) {
		options.auto_detect = false;
	}

	shared_ptr<CSVBufferManager> buffer_manager;
	if (file_idx == 0) {
		buffer_manager = csv_data.buffer_manager;
		if (buffer_manager && buffer_manager->GetFilePath() != file.path) {
			buffer_manager.reset();
		}
	}
	return make_shared_ptr<CSVFileScan>(context, file, std::move(options), bind_data.file_options, bind_data.names,
	                                    bind_data.types, csv_data.csv_schema, gstate.SingleThreadedRead(),
	                                    std::move(buffer_manager), false);
}